

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

void __thiscall
CLI::Validator::_merge_description(Validator *this,Validator *val1,Validator *val2,string *merger)

{
  undefined1 local_80 [96];
  
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)local_80,&val1->desc_function_);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
              *)(local_80 + 0x20),&val2->desc_function_);
  ::std::__cxx11::string::string((string *)(local_80 + 0x40),(string *)merger);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,(anon_class_96_3_da09e219 *)local_80);
  _merge_description(CLI::Validator_const&,CLI::Validator_const&,std::__cxx11::string_const&)::
  {lambda()#1}::~basic_string((_lambda___1_ *)local_80);
  return;
}

Assistant:

CLI11_INLINE void
Validator::_merge_description(const Validator &val1, const Validator &val2, const std::string &merger) {

    const std::function<std::string()> &dfunc1 = val1.desc_function_;
    const std::function<std::string()> &dfunc2 = val2.desc_function_;

    desc_function_ = [=]() {
        std::string f1 = dfunc1();
        std::string f2 = dfunc2();
        if((f1.empty()) || (f2.empty())) {
            return f1 + f2;
        }
        return std::string(1, '(') + f1 + ')' + merger + '(' + f2 + ')';
    };
}